

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O0

void __thiscall jsoncons::detail::chars_to::chars_to(chars_to *this)

{
  lconv *plVar1;
  void *in_RDI;
  size_type in_stack_00000008;
  vector<char,_std::allocator<char>_> *in_stack_00000010;
  lconv *lc;
  
  memset(in_RDI,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1ab9f7);
  plVar1 = localeconv();
  if ((plVar1 == (lconv *)0x0) || (*plVar1->decimal_point == '\0')) {
    *(undefined1 *)((long)in_RDI + 0x18) = 0x2e;
  }
  else {
    *(char *)((long)in_RDI + 0x18) = *plVar1->decimal_point;
  }
  std::vector<char,_std::allocator<char>_>::reserve(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

chars_to()
        : buffer_()
    {
        struct lconv * lc = localeconv();
        if (lc != nullptr && lc->decimal_point[0] != 0)
        {
            decimal_point_ = lc->decimal_point[0];    
        }
        else
        {
            decimal_point_ = '.'; 
        }
        buffer_.reserve(100);
    }